

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

bool __thiscall
duckdb::BitpackingState<short,short>::
Flush<duckdb::BitpackingCompressionState<short,true,short>::BitpackingWriter>
          (BitpackingState<short,short> *this)

{
  BitpackingState<short,short> *pBVar1;
  short *psVar2;
  int16_t left;
  idx_t iVar3;
  short *values;
  ushort uVar4;
  BitpackingState<short,short> BVar5;
  byte bVar6;
  ushort uVar7;
  long lVar8;
  unsigned_long uVar9;
  uint uVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  short sVar14;
  idx_t iVar15;
  bool bVar16;
  ulong uVar17;
  
  bVar16 = true;
  if (*(idx_t *)(this + 0x2810) == 0) {
    return true;
  }
  if (this[0x2837] == (BitpackingState<short,short>)0x0) {
    sVar14 = *(short *)(this + 0x2828);
    left = *(int16_t *)(this + 0x282a);
    if (left != sVar14) goto LAB_0171f891;
  }
  left = *(int16_t *)(this + 0x282a);
  if ((byte)((char)this[0x283a] - 1U) < 2) {
    BitpackingCompressionState<short,_true,_short>::BitpackingWriter::WriteConstant
              (left,*(idx_t *)(this + 0x2810),*(void **)(this + 0x2820),(bool)this[0x2837]);
    *(long *)(this + 0x2818) = *(long *)(this + 0x2818) + 6;
    return true;
  }
  sVar14 = *(short *)(this + 0x2828);
LAB_0171f891:
  pBVar1 = this + 0x282c;
  BVar5 = (BitpackingState<short,short>)
          TrySubtractOperator::Operation<short,short,short>(left,sVar14,(int16_t *)pBVar1);
  this[0x2839] = BVar5;
  BitpackingState<short,_short>::CalculateDeltaStats((BitpackingState<short,_short> *)this);
  if (this[0x2838] == (BitpackingState<short,short>)0x1) {
    sVar14 = *(short *)(this + 0x282e);
    if ((*(short *)(this + 0x2830) == sVar14) && (((byte)this[0x283a] & 0xfe) != 4)) {
      BitpackingCompressionState<short,_true,_short>::BitpackingWriter::WriteConstantDelta
                (*(short *)(this + 0x2830),**(short **)(this + 0x1008),*(idx_t *)(this + 0x2810),
                 *(short **)(this + 0x1008),(bool *)(this + 0x2010),*(void **)(this + 0x2820));
      *(long *)(this + 0x2818) = *(long *)(this + 0x2818) + 8;
      return true;
    }
    uVar10 = (uint)*(ushort *)(this + 0x2832);
    if (*(ushort *)(this + 0x2832) == 0) {
      bVar6 = 0;
    }
    else {
      bVar11 = 0;
      do {
        bVar11 = bVar11 + 1;
        uVar7 = (ushort)uVar10;
        uVar10 = (uint)(int)(short)uVar7 >> 1;
      } while (1 < uVar7);
      bVar6 = 0x10;
      if (bVar11 < 0xf) {
        bVar6 = bVar11;
      }
    }
    uVar7 = *(ushort *)pBVar1;
    if (uVar7 == 0) {
      bVar11 = 0;
    }
    else {
      bVar11 = 0x10;
      if (uVar7 != 0x8000) {
        uVar4 = -uVar7;
        if (0 < (short)uVar7) {
          uVar4 = uVar7;
        }
        uVar10 = (uint)uVar4;
        bVar13 = 0;
        do {
          bVar12 = bVar13;
          bVar13 = bVar12 + 1;
          uVar7 = (ushort)uVar10;
          uVar10 = uVar10 >> 1;
        } while (1 < uVar7);
        bVar11 = 0x10;
        if (bVar13 < 0xe) {
          bVar11 = bVar12 + 2;
        }
      }
    }
    if ((bVar6 < bVar11) && (this[0x283a] != (BitpackingState<short,short>)0x5)) {
      pBVar1 = this + 0x1010;
      iVar3 = *(idx_t *)(this + 0x2810);
      if (iVar3 != 0) {
        iVar15 = 0;
        do {
          *(short *)(pBVar1 + iVar15 * 2) = *(short *)(pBVar1 + iVar15 * 2) - sVar14;
          iVar15 = iVar15 + 1;
        } while (iVar3 != iVar15);
        sVar14 = *(short *)(this + 0x282e);
      }
      BitpackingCompressionState<short,_true,_short>::BitpackingWriter::WriteDeltaFor
                ((short *)pBVar1,(bool *)(this + 0x2010),bVar6,sVar14,*(short *)(this + 0x2834),
                 *(short **)(this + 0x1008),iVar3,*(void **)(this + 0x2820));
      uVar17 = *(ulong *)(this + 0x2810);
      lVar8 = *(long *)(this + 0x2818) + 0xc;
      *(long *)(this + 0x2818) = lVar8;
      if ((uVar17 & 0x1f) != 0) {
        uVar9 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar17 & 0x1f);
        uVar17 = (uVar17 - uVar9) + 0x20;
        lVar8 = *(long *)(this + 0x2818);
      }
      *(ulong *)(this + 0x2818) = (bVar6 * uVar17 >> 3) + lVar8;
      return true;
    }
  }
  if (this[0x2839] == (BitpackingState<short,short>)0x1) {
    uVar10 = (uint)*(ushort *)pBVar1;
    if (*(ushort *)pBVar1 == 0) {
      bVar6 = 0;
    }
    else {
      bVar11 = 0;
      do {
        bVar11 = bVar11 + 1;
        uVar7 = (ushort)uVar10;
        uVar10 = (uint)(int)(short)uVar7 >> 1;
      } while (1 < uVar7);
      bVar6 = 0x10;
      if (bVar11 < 0xf) {
        bVar6 = bVar11;
      }
    }
    values = *(short **)(this + 0x1008);
    sVar14 = *(short *)(this + 0x2828);
    iVar3 = *(idx_t *)(this + 0x2810);
    if (iVar3 != 0) {
      iVar15 = 0;
      do {
        psVar2 = values + iVar15;
        *psVar2 = *psVar2 - sVar14;
        iVar15 = iVar15 + 1;
      } while (iVar3 != iVar15);
      sVar14 = *(short *)(this + 0x2828);
    }
    BitpackingCompressionState<short,_true,_short>::BitpackingWriter::WriteFor
              (values,(bool *)(this + 0x2010),bVar6,sVar14,iVar3,*(void **)(this + 0x2820));
    uVar17 = *(ulong *)(this + 0x2810);
    if ((uVar17 & 0x1f) != 0) {
      uVar9 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar17 & 0x1f);
      uVar17 = (uVar17 - uVar9) + 0x20;
    }
    *(ulong *)(this + 0x2818) = *(long *)(this + 0x2818) + (bVar6 * uVar17 >> 3) + 10;
  }
  else {
    bVar16 = false;
  }
  return bVar16;
}

Assistant:

bool Flush() {
		if (compression_buffer_idx == 0) {
			return true;
		}

		if ((all_invalid || maximum == minimum) && (mode == BitpackingMode::AUTO || mode == BitpackingMode::CONSTANT)) {
			OP::WriteConstant(maximum, compression_buffer_idx, data_ptr, all_invalid);
			total_size += sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
			return true;
		}

		CalculateFORStats();
		CalculateDeltaStats();

		if (can_do_delta) {
			if (maximum_delta == minimum_delta && mode != BitpackingMode::FOR && mode != BitpackingMode::DELTA_FOR) {
				// FOR needs to be T (considering hugeint is bigger than idx_t)
				T frame_of_reference = compression_buffer[0];

				OP::WriteConstantDelta(maximum_delta, static_cast<T>(frame_of_reference), compression_buffer_idx,
				                       compression_buffer, compression_buffer_validity, data_ptr);
				total_size += sizeof(T) + sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
				return true;
			}

			// Check if delta has benefit
			auto delta_required_bitwidth =
			    BitpackingPrimitives::MinimumBitWidth<T, false>(static_cast<T>(min_max_delta_diff));
			auto regular_required_bitwidth = BitpackingPrimitives::MinimumBitWidth(min_max_diff);

			if (delta_required_bitwidth < regular_required_bitwidth && mode != BitpackingMode::FOR) {
				SubtractFrameOfReference(delta_buffer, minimum_delta);

				OP::WriteDeltaFor(reinterpret_cast<T *>(delta_buffer), compression_buffer_validity,
				                  delta_required_bitwidth, static_cast<T>(minimum_delta), delta_offset,
				                  compression_buffer, compression_buffer_idx, data_ptr);

				// FOR (frame of reference).
				total_size += sizeof(T);
				// Aligned bitpacking width.
				total_size += AlignValue(sizeof(bitpacking_width_t));
				// Delta offset.
				total_size += sizeof(T);
				// Compressed data size.
				total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, delta_required_bitwidth);

				return true;
			}
		}

		if (can_do_for) {
			auto width = BitpackingPrimitives::MinimumBitWidth<T, false>(min_max_diff);
			SubtractFrameOfReference(compression_buffer, minimum);
			OP::WriteFor(compression_buffer, compression_buffer_validity, width, minimum, compression_buffer_idx,
			             data_ptr);

			total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, width);
			total_size += sizeof(T); // FOR value
			total_size += AlignValue(sizeof(bitpacking_width_t));

			return true;
		}

		return false;
	}